

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
FindInitFaceConfiguration
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          FaceIndex face_id,CornerIndex *out_corner)

{
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *in_RDX;
  CornerTable *in_RDI;
  CornerIndex right_corner;
  int i;
  CornerIndex corner_index;
  CornerTable *in_stack_ffffffffffffff98;
  CornerIndex corner;
  pointer *in_stack_ffffffffffffffa0;
  CornerIndex in_stack_ffffffffffffffb0;
  ThisIndexType local_48;
  uint local_44;
  ThisIndexType local_40;
  uint local_3c;
  ThisIndexType local_38;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_34;
  uint local_30;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_2c;
  uint local_28;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_24;
  int local_20;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_1c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_18;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_8 [2];
  
  local_18 = in_RDX;
  uVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(local_8);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_1c,uVar2 * 3);
  local_20 = 0;
  while( true ) {
    corner.value_ = (uint)in_stack_ffffffffffffffa0;
    if (2 < local_20) {
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_18,&local_1c);
      return true;
    }
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19c374)
    ;
    local_28 = local_1c.value_;
    local_24.value_ = (uint)CornerTable::Opposite(in_stack_ffffffffffffff98,corner);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_24,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (bVar1) break;
    in_stack_ffffffffffffffa0 =
         &in_RDI[2].opposite_corners_.vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19c3d8)
    ;
    local_30 = local_1c.value_;
    local_2c.value_ = (uint)CornerTable::Vertex(in_RDI,in_stack_ffffffffffffffb0);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_2c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,(ulong)uVar2)
    ;
    if (*pvVar3 != -1) {
      local_34.value_ = local_1c.value_;
      while (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                               (&local_34,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                &kInvalidCornerIndex), bVar1) {
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_1c,&local_34);
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x19c44d);
        local_3c = local_34.value_;
        local_38.value_ = (uint)CornerTable::SwingRight(in_RDI,in_stack_ffffffffffffffb0);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_34,&local_38);
      }
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19c484);
      local_44 = local_1c.value_;
      local_40.value_ = (uint)CornerTable::Previous(in_RDI,in_stack_ffffffffffffffb0);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_18,&local_40);
      return false;
    }
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19c4c0)
    ;
    local_48.value_ = (uint)CornerTable::Next(in_RDI,in_stack_ffffffffffffffb0);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_1c,&local_48);
    local_20 = local_20 + 1;
  }
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_18,&local_1c);
  return false;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindInitFaceConfiguration(
    FaceIndex face_id, CornerIndex *out_corner) const {
  CornerIndex corner_index = CornerIndex(3 * face_id.value());
  for (int i = 0; i < 3; ++i) {
    if (corner_table_->Opposite(corner_index) == kInvalidCornerIndex) {
      // If there is a boundary edge, the configuration is exterior and return
      // the CornerIndex opposite to the first boundary edge.
      *out_corner = corner_index;
      return false;
    }
    if (vertex_hole_id_[corner_table_->Vertex(corner_index).value()] != -1) {
      // Boundary vertex found. Find the first boundary edge attached to the
      // point and return the corner opposite to it.
      CornerIndex right_corner = corner_index;
      while (right_corner != kInvalidCornerIndex) {
        corner_index = right_corner;
        right_corner = corner_table_->SwingRight(right_corner);
      }
      // |corner_index| now lies on a boundary edge and its previous corner is
      // guaranteed to be the opposite corner of the boundary edge.
      *out_corner = corner_table_->Previous(corner_index);
      return false;
    }
    corner_index = corner_table_->Next(corner_index);
  }
  // Else we have an interior configuration. Return the first corner id.
  *out_corner = corner_index;
  return true;
}